

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::operator=
          (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *this,
          unsigned_short *val)

{
  anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_20;
  
  local_20.int64_.val_ = (int64_t)*val;
  local_20.common_ = (common_storage)0x3;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             &local_20.common_);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             &local_20.common_);
  return (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this;
}

Assistant:

basic_json& operator=(const T& val)
        {
            *this = json_type_traits<basic_json,T>::to_json(val);
            return *this;
        }